

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_tec(REF_INTERP ref_interp,char *filename)

{
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  FILE *__s;
  REF_LIST pRVar3;
  long lVar4;
  REF_STATUS RVar5;
  long lVar6;
  
  if (ref_interp->visualize->n == 0) {
    RVar5 = 0;
  }
  else {
    pRVar1 = ref_interp->to_grid->node;
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x9dd,"ref_interp_tec","unable to open file");
      RVar5 = 2;
    }
    else {
      fwrite("title=\"refine interp\"\n",0x16,1,__s);
      fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
      RVar5 = 0;
      fprintf(__s,"zone t=\"exhaust\", i=%d, datapacking=%s\n",(ulong)(uint)ref_interp->visualize->n
              ,"point");
      pRVar3 = ref_interp->visualize;
      if (0 < pRVar3->n) {
        lVar6 = 0;
        do {
          pRVar2 = pRVar1->real;
          lVar4 = (long)pRVar3->value[lVar6];
          fprintf(__s,"%.15e %.15e %.15e\n",pRVar2[lVar4 * 0xf],pRVar2[lVar4 * 0xf + 1],
                  pRVar2[lVar4 * 0xf + 2]);
          lVar6 = lVar6 + 1;
          pRVar3 = ref_interp->visualize;
        } while (lVar6 < pRVar3->n);
      }
      fclose(__s);
    }
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_interp_tec(REF_INTERP ref_interp, const char *filename) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_NODE ref_node = ref_grid_node(to_grid);
  FILE *file;
  REF_INT item;

  /* skip if noting to show */
  if (0 == ref_list_n(ref_interp->visualize)) return REF_SUCCESS;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine interp\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  fprintf(file, "zone t=\"exhaust\", i=%d, datapacking=%s\n",
          ref_list_n(ref_interp->visualize), "point");

  each_ref_list_item(ref_interp->visualize, item) fprintf(
      file, "%.15e %.15e %.15e\n",
      ref_node_xyz(ref_node, 0, ref_list_value(ref_interp->visualize, item)),
      ref_node_xyz(ref_node, 1, ref_list_value(ref_interp->visualize, item)),
      ref_node_xyz(ref_node, 2, ref_list_value(ref_interp->visualize, item)));

  fclose(file);
  return REF_SUCCESS;
}